

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O1

void readRgba1(char *fileName,Array2D<Imf_2_5::Rgba> *pixels,int *width,int *height)

{
  int scanLine1;
  int scanLine2;
  int iVar1;
  int iVar2;
  Box2i *pBVar3;
  ulong uVar4;
  Rgba *pRVar5;
  long lVar6;
  RgbaInputFile file;
  RgbaInputFile local_68;
  
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile(&local_68,fileName,iVar2);
  pBVar3 = Imf_2_5::RgbaInputFile::dataWindow(&local_68);
  iVar2 = (pBVar3->min).x;
  scanLine1 = (pBVar3->min).y;
  scanLine2 = (pBVar3->max).y;
  *width = ((pBVar3->max).x - iVar2) + 1;
  lVar6 = ((long)scanLine2 - (long)scanLine1) + 1;
  *height = (int)lVar6;
  iVar1 = *width;
  uVar4 = iVar1 * lVar6;
  pRVar5 = (Rgba *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
  if (pixels->_data != (Rgba *)0x0) {
    operator_delete__(pixels->_data);
  }
  pixels->_sizeX = lVar6;
  pixels->_sizeY = (long)iVar1;
  pixels->_data = pRVar5;
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (&local_68,pRVar5 + (-(long)iVar2 - (long)*width * (long)scanLine1),1,(long)*width);
  Imf_2_5::RgbaInputFile::readPixels(&local_68,scanLine1,scanLine2);
  Imf_2_5::RgbaInputFile::~RgbaInputFile(&local_68);
  return;
}

Assistant:

void
readRgba1 (const char fileName[],
	   Array2D<Rgba> &pixels,
	   int &width,
	   int &height)
{
    //
    // Read an RGBA image using class RgbaInputFile:
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the memory layout of the pixels
    //	- read the pixels from the file
    //

    RgbaInputFile file (fileName);
    Box2i dw = file.dataWindow();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    pixels.resizeErase (height, width);

    file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);
    file.readPixels (dw.min.y, dw.max.y);
}